

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_graph.cpp
# Opt level: O1

ListGraph * load_pace_graph_impl(ListGraph *__return_storage_ptr__,istream *in)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  istream *piVar5;
  istream *piVar6;
  long *plVar7;
  runtime_error *prVar8;
  size_type *psVar9;
  long *plVar10;
  int __val;
  int iVar11;
  int iVar12;
  bool bVar13;
  int t;
  int h;
  string sp;
  string p;
  int arc_count;
  int node_count;
  string line;
  istringstream lin;
  int local_290;
  int local_28c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  ulong local_248;
  undefined1 local_240 [32];
  int *local_220;
  int local_218;
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  ios_base local_138 [264];
  
  (__return_storage_ptr__->head).super_ArrayIDFunc<int>.preimage_count_ = 0;
  (__return_storage_ptr__->head).super_ArrayIDFunc<int>.data_ = (int *)0x0;
  (__return_storage_ptr__->head).image_count_ = 0;
  (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.preimage_count_ = 0;
  (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.data_ = (int *)0x0;
  (__return_storage_ptr__->tail).image_count_ = 0;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  __val = 0;
  local_248 = 0;
  bVar13 = false;
  while( true ) {
    do {
      __val = __val + 1;
      cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)in + -0x18) + (char)in);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (in,(string *)&local_1d0,cVar2);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
        if ((int)local_248 == (__return_storage_ptr__->head).super_ArrayIDFunc<int>.preimage_count_)
        {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p);
          }
          return __return_storage_ptr__;
        }
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string
                  (&local_1f0,(__return_storage_ptr__->head).super_ArrayIDFunc<int>.preimage_count_)
        ;
        std::operator+(&local_288,"The arc count in the header (",&local_1f0);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_288);
        local_268._M_dataplus._M_p = (pointer)*plVar7;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_268._M_dataplus._M_p == psVar9) {
          local_268.field_2._M_allocated_capacity = *psVar9;
          local_268.field_2._8_8_ = plVar7[3];
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        }
        else {
          local_268.field_2._M_allocated_capacity = *psVar9;
        }
        local_268._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::to_string(&local_210,(int)local_248);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_240,&local_268,&local_210);
        plVar7 = (long *)std::__cxx11::string::append(local_240);
        local_1b0 = (long *)*plVar7;
        plVar10 = plVar7 + 2;
        if (local_1b0 == plVar10) {
          local_1a0 = *plVar10;
          lStack_198 = plVar7[3];
          local_1b0 = &local_1a0;
        }
        else {
          local_1a0 = *plVar10;
        }
        local_1a8 = plVar7[1];
        *plVar7 = (long)plVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::runtime_error::runtime_error(prVar8,(string *)&local_1b0);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    } while ((local_1d0._M_string_length == 0) || (*local_1d0._M_dataplus._M_p == 'c'));
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&local_1b0,(string *)&local_1d0,_S_in);
    if (!bVar13) break;
    piVar6 = (istream *)std::istream::operator>>((istream *)&local_1b0,&local_290);
    plVar7 = (long *)std::istream::operator>>(piVar6,&local_28c);
    if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_210,__val);
      std::operator+(&local_1f0,"Can not parse line num ",&local_210);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
      local_288._M_dataplus._M_p = (pointer)*plVar7;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_288._M_dataplus._M_p == psVar9) {
        local_288.field_2._M_allocated_capacity = *psVar9;
        local_288.field_2._8_8_ = plVar7[3];
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      }
      else {
        local_288.field_2._M_allocated_capacity = *psVar9;
      }
      local_288._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::operator+(&local_268,&local_288,&local_1d0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_240._0_8_ = *plVar7;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_240._0_8_ == psVar9) {
        local_240._16_8_ = *psVar9;
        local_240._24_8_ = plVar7[3];
        local_240._0_8_ = local_240 + 0x10;
      }
      else {
        local_240._16_8_ = *psVar9;
      }
      local_240._8_8_ = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(prVar8,(string *)local_240);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = local_28c + -1;
    iVar11 = local_290 + -1;
    if (local_28c < 1) {
LAB_001196d4:
      local_290 = iVar11;
      local_28c = iVar3;
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_210,__val);
      std::operator+(&local_1f0,"Invalid arc in line num ",&local_210);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
      local_288._M_dataplus._M_p = (pointer)*plVar7;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_288._M_dataplus._M_p == psVar9) {
        local_288.field_2._M_allocated_capacity = *psVar9;
        local_288.field_2._8_8_ = plVar7[3];
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      }
      else {
        local_288.field_2._M_allocated_capacity = *psVar9;
      }
      local_288._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::operator+(&local_268,&local_288,&local_1d0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_240._0_8_ = *plVar7;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_240._0_8_ == psVar9) {
        local_240._16_8_ = *psVar9;
        local_240._24_8_ = plVar7[3];
        local_240._0_8_ = local_240 + 0x10;
      }
      else {
        local_240._16_8_ = *psVar9;
      }
      local_240._8_8_ = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(prVar8,(string *)local_240);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar12 = (__return_storage_ptr__->head).image_count_;
    if (((iVar12 < local_28c) || (local_290 < 1)) || (iVar12 < local_290)) goto LAB_001196d4;
    iVar12 = (int)local_248;
    if (iVar12 < (__return_storage_ptr__->head).super_ArrayIDFunc<int>.preimage_count_) {
      (__return_storage_ptr__->head).super_ArrayIDFunc<int>.data_[iVar12] = iVar3;
      (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.data_[iVar12] = iVar11;
    }
    iVar4 = iVar12 + 1;
    if (iVar4 < (__return_storage_ptr__->head).super_ArrayIDFunc<int>.preimage_count_) {
      (__return_storage_ptr__->head).super_ArrayIDFunc<int>.data_[iVar4] = iVar11;
      (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.data_[iVar4] = iVar3;
    }
    local_248 = (ulong)(iVar12 + 2);
    local_290 = iVar11;
    local_28c = iVar3;
LAB_001195e0:
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
    std::ios_base::~ios_base(local_138);
  }
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity =
       local_268.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  local_288._M_string_length = 0;
  local_288.field_2._M_allocated_capacity =
       local_288.field_2._M_allocated_capacity & 0xffffffffffffff00;
  piVar5 = std::operator>>((istream *)&local_1b0,(string *)&local_268);
  piVar5 = std::operator>>(piVar5,(string *)&local_288);
  piVar6 = (istream *)std::istream::operator>>((istream *)piVar5,(int *)&local_1f0);
  plVar7 = (long *)std::istream::operator>>(piVar6,(int *)&local_210);
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"Can not parse header in pace file.");
    goto LAB_001197e6;
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_268);
  if (iVar3 == 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_288);
    if ((iVar3 == 0) && (-1 < (int)local_1f0._M_dataplus._M_p)) {
      if (-1 < (int)local_210._M_dataplus._M_p) {
        ListGraph::ListGraph
                  ((ListGraph *)local_240,(int)local_1f0._M_dataplus._M_p,
                   (int)local_210._M_dataplus._M_p * 2);
        piVar1 = (__return_storage_ptr__->head).super_ArrayIDFunc<int>.data_;
        if (piVar1 != (int *)0x0) {
          operator_delete__(piVar1);
        }
        (__return_storage_ptr__->head).super_ArrayIDFunc<int>.data_ = (int *)0x0;
        (__return_storage_ptr__->head).super_ArrayIDFunc<int>.preimage_count_ = 0;
        (__return_storage_ptr__->head).super_ArrayIDFunc<int>.preimage_count_ = local_240._0_4_;
        local_240._0_8_ = local_240._0_8_ & 0xffffffff00000000;
        (__return_storage_ptr__->head).super_ArrayIDFunc<int>.data_ = (int *)local_240._8_8_;
        local_240._8_8_ = (int *)0x0;
        (__return_storage_ptr__->head).image_count_ = local_240._16_4_;
        piVar1 = (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.data_;
        if (piVar1 != (int *)0x0) {
          operator_delete__(piVar1);
        }
        (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.data_ = (int *)0x0;
        (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.preimage_count_ = 0;
        (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.preimage_count_ = local_240._24_4_;
        local_240._24_8_ = local_240._24_8_ & 0xffffffff00000000;
        (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.data_ = local_220;
        local_220 = (int *)0x0;
        (__return_storage_ptr__->tail).image_count_ = local_218;
        if ((int *)local_240._8_8_ != (int *)0x0) {
          operator_delete__((void *)local_240._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p);
        }
        bVar13 = true;
        goto LAB_001195e0;
      }
    }
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar8,"Invalid header in pace file.");
LAB_001197e6:
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static ListGraph load_pace_graph_impl(std::istream& in)
{
    ListGraph graph;
    std::string line;
    int line_num = 0;
    int next_arc = 0;

    bool was_header_read = false;
    while (std::getline(in, line)) {
        ++line_num;
        if (line.empty() || line[0] == 'c')
            continue;

        std::istringstream lin(line);
        if (!was_header_read) {
            was_header_read = true;
            std::string p, sp;
            int node_count;
            int arc_count;
            if (!(lin >> p >> sp >> node_count >> arc_count))
                throw std::runtime_error("Can not parse header in pace file.");
            if (p != "p" || sp != "tdp" || node_count < 0 || arc_count < 0)
                throw std::runtime_error("Invalid header in pace file.");
            graph = ListGraph(node_count, 2 * arc_count);
        } else {
            int h, t;
            if (!(lin >> t >> h))
                throw std::runtime_error("Can not parse line num " + std::to_string(line_num) + " \"" + line + "\" in pace file.");
            --h;
            --t;
            if (h < 0 || h >= graph.node_count() || t < 0 || t >= graph.node_count())
                throw std::runtime_error("Invalid arc in line num " + std::to_string(line_num) + " \"" + line + "\" in pace file.");
            if (next_arc < graph.arc_count()) {
                graph.head[next_arc] = h;
                graph.tail[next_arc] = t;
            }
            ++next_arc;
            if (next_arc < graph.arc_count()) {
                graph.head[next_arc] = t;
                graph.tail[next_arc] = h;
            }
            ++next_arc;
        }
    }

    if (next_arc != graph.arc_count())
        throw std::runtime_error(
            "The arc count in the header (" + std::to_string(graph.arc_count()) + ") does not correspond with the actual number of arcs (" + std::to_string(next_arc) + ").");

    return graph; // NVRO
}